

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,short element)

{
  uint8_t *puVar1;
  uint uVar2;
  
  if (this->minalign_ < 2) {
    this->minalign_ = 2;
  }
  vector_downward<unsigned_int>::fill(&this->buf_,(ulong)((this->buf_).size_ & 1));
  vector_downward<unsigned_int>::ensure_space(&this->buf_,2);
  puVar1 = (this->buf_).cur_;
  (this->buf_).cur_ = puVar1 + -2;
  uVar2 = (this->buf_).size_ + 2;
  (this->buf_).size_ = uVar2;
  *(short *)(puVar1 + -2) = element;
  return uVar2;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }